

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potion.c
# Opt level: O1

void djinni_from_bottle(obj *obj)

{
  uint uVar1;
  monst *mtmp;
  char *pcVar2;
  bool bVar3;
  
  mtmp = makemon(mons + 0x147,level,(int)u.ux,(int)u.uy,0);
  if (mtmp != (monst *)0x0) {
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      pcVar2 = a_monnam(mtmp);
      pline("In a cloud of smoke, %s emerges!",pcVar2);
      Monnam(mtmp);
      pline("%s speaks.");
    }
    else {
      pline("You smell acrid fumes.");
      pline("Something speaks.");
    }
    uVar1 = mt_random();
    uVar1 = uVar1 % 5;
    if ((*(uint *)&obj->field_0x4a & 2) == 0) {
      if (((*(uint *)&obj->field_0x4a & 1) != 0) && (bVar3 = uVar1 == 0, uVar1 = 4, bVar3)) {
        uVar1 = mt_random();
        uVar1 = uVar1 & 3;
      }
    }
    else {
      bVar3 = uVar1 == 4;
      uVar1 = 0;
      if (bVar3) {
        uVar1 = mt_random();
        uVar1 = (uVar1 & 3) + 1;
      }
    }
    switch(uVar1) {
    case 0:
      verbalize("I am in your debt.  I will grant one wish!");
      makewish('\0');
      break;
    case 1:
      verbalize("Thank you for freeing me!");
      tamedog(mtmp,(obj *)0x0);
      return;
    case 2:
      verbalize("You freed me!");
      mtmp->field_0x62 = mtmp->field_0x62 | 0x40;
      set_malign(mtmp);
      return;
    case 3:
      verbalize("It is about time!");
      pcVar2 = Monnam(mtmp);
      pline("%s vanishes.",pcVar2);
      break;
    default:
      verbalize("You disturbed me, fool!");
      return;
    }
    mongone(mtmp);
    return;
  }
  pline("It turns out to be empty.");
  return;
}

Assistant:

void djinni_from_bottle(struct obj *obj)
{
	struct monst *mtmp;
	int chance;

	if (!(mtmp = makemon(&mons[PM_DJINNI], level, u.ux, u.uy, NO_MM_FLAGS))){
		pline("It turns out to be empty.");
		return;
	}

	if (!Blind) {
		pline("In a cloud of smoke, %s emerges!", a_monnam(mtmp));
		pline("%s speaks.", Monnam(mtmp));
	} else {
		pline("You smell acrid fumes.");
		pline("Something speaks.");
	}

	chance = rn2(5);
	if (obj->blessed) chance = (chance == 4) ? rnd(4) : 0;
	else if (obj->cursed) chance = (chance == 0) ? rn2(4) : 4;
	/* 0,1,2,3,4:  b=80%,5,5,5,5; nc=20%,20,20,20,20; c=5%,5,5,5,80 */

	switch (chance) {
	case 0 : verbalize("I am in your debt.  I will grant one wish!");
		makewish(FALSE);
		mongone(mtmp);
		break;
	case 1 : verbalize("Thank you for freeing me!");
		tamedog(mtmp, NULL);
		break;
	case 2 : verbalize("You freed me!");
		mtmp->mpeaceful = TRUE;
		set_malign(mtmp);
		break;
	case 3 : verbalize("It is about time!");
		pline("%s vanishes.", Monnam(mtmp));
		mongone(mtmp);
		break;
	default: verbalize("You disturbed me, fool!");
		break;
	}
}